

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O2

void google::protobuf::io::Tokenizer::ParseStringAppend(string *text,string *output)

{
  char *pcVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  LogMessage *this;
  char *in_RCX;
  pointer pcVar5;
  pointer pcVar6;
  char cVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t uVar10;
  string_view src;
  long lStack_70;
  uint32_t unicode;
  uint32_t local_64;
  LogMessage local_60;
  string local_50;
  
  if (text->_M_string_length == 0) {
    absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_60,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer.cc"
               ,0x48a);
    this = absl::lts_20250127::log_internal::LogMessage::operator<<
                     (&local_60,
                      (char (*) [93])
                      " Tokenizer::ParseStringAppend() passed text that could not have been tokenized as a string: "
                     );
    src._M_str = in_RCX;
    src._M_len = (size_t)(text->_M_dataplus)._M_p;
    absl::lts_20250127::CEscape_abi_cxx11_(&local_50,(lts_20250127 *)text->_M_string_length,src);
    absl::lts_20250127::log_internal::LogMessage::operator<<(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
              ((LogMessageDebugFatal *)&local_60);
    return;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)(output->_M_dataplus)._M_p == &output->field_2) {
    uVar8 = 0xf;
  }
  else {
    uVar8 = (output->field_2)._M_allocated_capacity;
  }
  if (uVar8 < text->_M_string_length + output->_M_string_length) {
    std::__cxx11::string::reserve((ulong)output);
  }
  pcVar6 = (text->_M_dataplus)._M_p;
LAB_00291fef:
  while( true ) {
    cVar2 = pcVar6[1];
    cVar7 = (char)output;
    if (cVar2 == '\\') break;
    if (cVar2 == '\0') {
      return;
    }
LAB_0029205a:
    pcVar5 = pcVar6 + 1;
    if ((cVar2 != *(text->_M_dataplus)._M_p) ||
       (pcVar1 = pcVar6 + 2, pcVar6 = pcVar5, *pcVar1 != '\0')) goto LAB_0029206e;
  }
  bVar3 = pcVar6[2];
  if (bVar3 == 0) goto LAB_0029205a;
  pcVar5 = pcVar6 + 2;
  if ((bVar3 & 0xf8) == 0x30) {
    if ((pcVar6[3] & 0xf8U) == 0x30) {
      pcVar5 = pcVar6 + 3;
    }
    if ((pcVar5[1] & 0xf8U) == 0x30) {
      pcVar5 = pcVar5 + 1;
    }
    goto LAB_0029206e;
  }
  switch(bVar3) {
  case 0x6e:
    break;
  case 0x6f:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x77:
switchD_002920da_caseD_6f:
    break;
  case 0x72:
    break;
  case 0x74:
    break;
  case 0x75:
switchD_002920da_caseD_75:
    uVar8 = (ulong)(bVar3 == 0x55) << 3;
    if (bVar3 == 0x75) {
      uVar8 = 4;
    }
    bVar4 = ReadHexDigits(pcVar6 + 3,(int)uVar8,&unicode);
    uVar10 = unicode;
    if (bVar4) {
      uVar9 = uVar8 | 3;
      if ((unicode & 0xfffffc00) == 0xd800) {
        if (((pcVar6[uVar8 + 3] == '\\') && (pcVar6[uVar8 + 4] == 'u')) &&
           ((bVar4 = ReadHexDigits(pcVar6 + uVar8 + 5,4,(uint32_t *)&local_50), bVar4 &&
            (((uint)local_50._M_dataplus._M_p & 0xfffffc00) == 0xdc00)))) {
          uVar10 = uVar10 * 0x400 + (uint)local_50._M_dataplus._M_p + 0xfca02400;
          uVar9 = uVar8 + 9;
          unicode = uVar10;
        }
        pcVar6 = pcVar6 + uVar9;
        local_60.errno_saver_.saved_errno_ = uVar10;
LAB_002921be:
        if ((uint)local_60.errno_saver_.saved_errno_ < 0x10000) {
          uVar10 = (local_60.errno_saver_.saved_errno_ & 0xf000U) * 0x10 +
                   (local_60.errno_saver_.saved_errno_ & 0x3fU) +
                   (local_60.errno_saver_.saved_errno_ & 0xfc0U) * 4 + 0xe08080;
          lStack_70 = 3;
          goto LAB_002922ee;
        }
        if ((uint)local_60.errno_saver_.saved_errno_ < 0x110000) {
          uVar10 = (local_60.errno_saver_.saved_errno_ & 0x3fU |
                    (local_60.errno_saver_.saved_errno_ & 0x3f000U) << 4 |
                   (local_60.errno_saver_.saved_errno_ & 0x1c0000U) << 6) + 0xf0808080 +
                   (local_60.errno_saver_.saved_errno_ & 0xfc0U) * 4;
          lStack_70 = 4;
          goto LAB_002922ee;
        }
        local_50._M_dataplus._M_p = "\\U%08x";
        local_50._M_string_length = 6;
        absl::lts_20250127::StrAppendFormat<unsigned_int>
                  (output,(FormatSpec<unsigned_int> *)&local_50,(uint *)&local_60);
      }
      else {
        pcVar6 = pcVar6 + uVar9;
        local_60.errno_saver_.saved_errno_ = unicode;
        if (unicode < 0x80) {
          lStack_70 = 1;
        }
        else {
          if (0x7ff < unicode) goto LAB_002921be;
          uVar10 = (unicode & 0x3f) + 0xc080 + (unicode & 0x7c0) * 4;
          lStack_70 = 2;
        }
LAB_002922ee:
        local_64 = ghtonl(uVar10);
        std::__cxx11::string::append((char *)output,(long)&local_60 - lStack_70);
      }
      pcVar6 = pcVar6 + -1;
    }
    else {
      std::__cxx11::string::push_back(cVar7);
      pcVar6 = pcVar5;
    }
    goto LAB_00291fef;
  case 0x76:
    break;
  case 0x78:
    goto switchD_002920da_caseD_78;
  default:
    if (((bVar3 != 0x22) && (bVar3 != 0x27)) && (bVar3 != 0x3f)) {
      if (bVar3 == 0x55) goto switchD_002920da_caseD_75;
      if (((bVar3 != 0x66) && (bVar3 != 0x5c)) && ((bVar3 != 0x61 && (bVar3 != 0x62)))) {
        if (bVar3 == 0x58) goto switchD_002920da_caseD_78;
        goto switchD_002920da_caseD_6f;
      }
    }
  }
LAB_0029206e:
  std::__cxx11::string::push_back(cVar7);
  pcVar6 = pcVar5;
  goto LAB_00291fef;
switchD_002920da_caseD_78:
  bVar4 = anon_unknown_0::HexDigit::InClass(pcVar6[3]);
  if (bVar4) {
    pcVar5 = pcVar6 + 3;
  }
  bVar4 = anon_unknown_0::HexDigit::InClass(pcVar5[1]);
  if (bVar4) {
    pcVar5 = pcVar5 + 1;
  }
  std::__cxx11::string::push_back(cVar7);
  pcVar6 = pcVar5;
  goto LAB_00291fef;
}

Assistant:

void Tokenizer::ParseStringAppend(const std::string& text,
                                  std::string* output) {
  // Reminder: text[0] is always a quote character.  (If text is
  // empty, it's invalid, so we'll just return).
  const size_t text_size = text.size();
  if (text_size == 0) {
    ABSL_DLOG(FATAL)
        << " Tokenizer::ParseStringAppend() passed text that could not"
           " have been tokenized as a string: "
        << absl::CEscape(text);
    return;
  }

  // Reserve room for new string. The branch is necessary because if
  // there is already space available the reserve() call might
  // downsize the output.
  const size_t new_len = text_size + output->size();
  if (new_len > output->capacity()) {
    output->reserve(new_len);
  }

  // Loop through the string copying characters to "output" and
  // interpreting escape sequences.  Note that any invalid escape
  // sequences or other errors were already reported while tokenizing.
  // In this case we do not need to produce valid results.
  for (const char* ptr = text.c_str() + 1; *ptr != '\0'; ptr++) {
    if (*ptr == '\\' && ptr[1] != '\0') {
      // An escape sequence.
      ++ptr;

      if (OctalDigit::InClass(*ptr)) {
        // An octal escape.  May one, two, or three digits.
        int code = DigitValue(*ptr);
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        if (OctalDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 8 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'x' || *ptr == 'X') {
        // A hex escape.  May zero, one, or two digits.  (The zero case
        // will have been caught as an error earlier.)
        int code = 0;
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = DigitValue(*ptr);
        }
        if (HexDigit::InClass(ptr[1])) {
          ++ptr;
          code = code * 16 + DigitValue(*ptr);
        }
        output->push_back(static_cast<char>(code));

      } else if (*ptr == 'u' || *ptr == 'U') {
        uint32_t unicode;
        const char* end = FetchUnicodePoint(ptr, &unicode);
        if (end == ptr) {
          // Failure: Just dump out what we saw, don't try to parse it.
          output->push_back(*ptr);
        } else {
          AppendUTF8(unicode, output);
          ptr = end - 1;  // Because we're about to ++ptr.
        }
      } else {
        // Some other escape code.
        output->push_back(TranslateEscape(*ptr));
      }

    } else if (*ptr == text[0] && ptr[1] == '\0') {
      // Ignore final quote matching the starting quote.
    } else {
      output->push_back(*ptr);
    }
  }
}